

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O0

bool __thiscall wallet::LegacyDataSPKM::GetKey(LegacyDataSPKM *this,CKeyID *address,CKey *keyOut)

{
  byte bVar1;
  bool bVar2;
  FillableSigningProvider *in_RDI;
  long in_FS_OFFSET;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *vchCryptedSecret;
  CPubKey *vchPubKey;
  const_iterator mi;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock33;
  function<bool_(const_std::vector<unsigned_char,_secure_allocator<unsigned_char>_>_&)>
  *in_stack_ffffffffffffff18;
  map<CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
  *in_stack_ffffffffffffff20;
  undefined6 in_stack_ffffffffffffff28;
  undefined1 in_stack_ffffffffffffff2e;
  undefined1 in_stack_ffffffffffffff2f;
  anon_class_24_3_27f4fde9 *__f;
  undefined8 in_stack_ffffffffffffff38;
  function<bool_(const_std::vector<unsigned_char,_secure_allocator<unsigned_char>_>_&)> *this_00;
  CKey *in_stack_ffffffffffffff40;
  undefined7 in_stack_ffffffffffffff48;
  undefined1 in_stack_ffffffffffffff4f;
  undefined7 in_stack_ffffffffffffff58;
  undefined1 in_stack_ffffffffffffff5f;
  bool local_61;
  undefined1 local_48 [32];
  _Base_ptr local_28;
  anon_class_24_3_27f4fde9 local_20;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)in_stack_ffffffffffffff18);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)
             CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58),
             (AnnotatedMixin<std::recursive_mutex> *)in_RDI,
             (char *)CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48),
             &in_stack_ffffffffffffff40->fCompressed,(int)((ulong)in_stack_ffffffffffffff38 >> 0x20)
             ,SUB81((ulong)in_stack_ffffffffffffff38 >> 0x18,0));
  bVar1 = (**(code **)(**(long **)&(in_RDI->mapKeys)._M_t._M_impl + 0x48))();
  if ((bVar1 & 1) == 0) {
    local_61 = FillableSigningProvider::GetKey
                         (in_RDI,(CKeyID *)
                                 CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48),
                          in_stack_ffffffffffffff40);
  }
  else {
    local_20.vchCryptedSecret =
         (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
         std::
         map<CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
         ::find(in_stack_ffffffffffffff20,(key_type *)in_stack_ffffffffffffff18);
    local_28 = (_Base_ptr)
               std::
               map<CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
               ::end(in_stack_ffffffffffffff20);
    bVar2 = std::operator==((_Self *)CONCAT17(in_stack_ffffffffffffff2f,
                                              CONCAT16(in_stack_ffffffffffffff2e,
                                                       in_stack_ffffffffffffff28)),
                            (_Self *)in_stack_ffffffffffffff20);
    if (((bVar2 ^ 0xffU) & 1) == 0) {
      local_61 = false;
    }
    else {
      __f = &local_20;
      std::
      _Rb_tree_const_iterator<std::pair<const_CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
      ::operator*((_Rb_tree_const_iterator<std::pair<const_CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                   *)in_stack_ffffffffffffff18);
      std::
      _Rb_tree_const_iterator<std::pair<const_CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
      ::operator*((_Rb_tree_const_iterator<std::pair<const_CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                   *)in_stack_ffffffffffffff18);
      this_00 = *(function<bool_(const_std::vector<unsigned_char,_secure_allocator<unsigned_char>_>_&)>
                  **)&(in_RDI->mapKeys)._M_t._M_impl;
      std::function<bool(std::vector<unsigned_char,secure_allocator<unsigned_char>>const&)>::
      function<wallet::LegacyDataSPKM::GetKey(CKeyID_const&,CKey&)const::__0,void>(this_00,__f);
      bVar1 = (**(code **)(*(long *)&(this_00->super__Function_base)._M_functor + 0x40))
                        (this_00,local_48);
      local_61 = (bool)(bVar1 & 1);
      std::function<bool_(const_std::vector<unsigned_char,_secure_allocator<unsigned_char>_>_&)>::
      ~function(in_stack_ffffffffffffff18);
    }
  }
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_ffffffffffffff18);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_61;
  }
  __stack_chk_fail();
}

Assistant:

bool LegacyDataSPKM::GetKey(const CKeyID &address, CKey& keyOut) const
{
    LOCK(cs_KeyStore);
    if (!m_storage.HasEncryptionKeys()) {
        return FillableSigningProvider::GetKey(address, keyOut);
    }

    CryptedKeyMap::const_iterator mi = mapCryptedKeys.find(address);
    if (mi != mapCryptedKeys.end())
    {
        const CPubKey &vchPubKey = (*mi).second.first;
        const std::vector<unsigned char> &vchCryptedSecret = (*mi).second.second;
        return m_storage.WithEncryptionKey([&](const CKeyingMaterial& encryption_key) {
            return DecryptKey(encryption_key, vchCryptedSecret, vchPubKey, keyOut);
        });
    }
    return false;
}